

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::writeTestCases(JUnitTestOutput *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  long *in_RDI;
  SimpleString buf;
  JUnitTestCaseResultNode *cur;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff84;
  undefined1 local_40 [8];
  undefined1 local_38 [24];
  undefined1 local_20 [8];
  SimpleString local_18;
  SimpleString *local_10;
  
  local_10 = *(SimpleString **)(in_RDI[3] + 0x20);
  while (local_10 != (SimpleString *)0x0) {
    pcVar3 = SimpleString::asCharString((SimpleString *)(in_RDI[3] + 0x38));
    bVar2 = SimpleString::isEmpty((SimpleString *)0x20e6b1);
    pcVar6 = ".";
    if (bVar2) {
      pcVar6 = "";
    }
    pcVar4 = SimpleString::asCharString((SimpleString *)(in_RDI[3] + 0x18));
    pcVar5 = SimpleString::asCharString(local_10);
    auVar1 = SEXT816((long)local_10[1].buffer_) * SEXT816(0x20c49ba5e353f7cf);
    iVar8 = (int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f);
    iVar7 = (int)local_10[1].buffer_ + iVar8 * -1000;
    StringFromFormat((char *)&local_18,
                     "<testcase classname=\"%s%s%s\" name=\"%s\" time=\"%d.%03d\">\n",pcVar3,pcVar6,
                     pcVar4,pcVar5);
    SimpleString::asCharString(&local_18);
    SimpleString::SimpleString
              ((SimpleString *)CONCAT44(in_stack_ffffffffffffff84,iVar7),
               (char *)CONCAT44(in_stack_ffffffffffffff7c,iVar8));
    (**(code **)(*in_RDI + 0xc0))(in_RDI,local_20);
    SimpleString::~SimpleString((SimpleString *)0x20e796);
    if (local_10[2].buffer_ == (char *)0x0) {
      if (((ulong)local_10[3].buffer_ & 1) != 0) {
        SimpleString::SimpleString
                  ((SimpleString *)CONCAT44(in_stack_ffffffffffffff84,iVar7),
                   (char *)CONCAT44(in_stack_ffffffffffffff7c,iVar8));
        (**(code **)(*in_RDI + 0xc0))(in_RDI,local_38);
        SimpleString::~SimpleString((SimpleString *)0x20e82f);
      }
    }
    else {
      (**(code **)(*in_RDI + 0xf0))(in_RDI,local_10);
    }
    SimpleString::SimpleString
              ((SimpleString *)CONCAT44(in_stack_ffffffffffffff84,iVar7),
               (char *)CONCAT44(in_stack_ffffffffffffff7c,iVar8));
    (**(code **)(*in_RDI + 0xc0))(in_RDI,local_40);
    SimpleString::~SimpleString((SimpleString *)0x20e882);
    local_10 = (SimpleString *)local_10[4].buffer_;
    SimpleString::~SimpleString((SimpleString *)0x20e89a);
  }
  return;
}

Assistant:

void JUnitTestOutput::writeTestCases()
{
    JUnitTestCaseResultNode* cur = impl_->results_.head_;
    while (cur) {
        SimpleString buf = StringFromFormat(
                "<testcase classname=\"%s%s%s\" name=\"%s\" time=\"%d.%03d\">\n",
                impl_->package_.asCharString(),
                impl_->package_.isEmpty() == true ? "" : ".",
                impl_->results_.group_.asCharString(),
                cur->name_.asCharString(), (int) (cur->execTime_ / 1000), (int)(cur->execTime_ % 1000));
        writeToFile(buf.asCharString());

        if (cur->failure_) {
            writeFailure(cur);
        }
        else if (cur->ignored_) {
            writeToFile("<skipped />\n");
        }
        writeToFile("</testcase>\n");
        cur = cur->next_;
    }
}